

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O1

bool __thiscall BamTools::RuleParser::readToken(RuleParser *this,RuleToken *token)

{
  byte *pbVar1;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  
  pbVar4 = (byte *)this->m_current;
  pbVar1 = (byte *)this->m_end;
  while (((pbVar4 != pbVar1 && ((ulong)*pbVar4 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
    this->m_current = (char *)pbVar4;
  }
  pbVar4 = (byte *)this->m_current;
  if (pbVar4 == pbVar1) {
LAB_001612e1:
    return pbVar4 != pbVar1;
  }
  (token->Value)._M_string_length = 0;
  *(token->Value)._M_dataplus._M_p = '\0';
  bVar7 = true;
  bVar3 = false;
LAB_001611a0:
  pcVar2 = this->m_current;
  if (pcVar2 == this->m_end) {
    cVar6 = '\0';
  }
  else {
    this->m_current = pcVar2 + 1;
    cVar6 = *pcVar2;
  }
  switch(cVar6) {
  case ' ':
    goto switchD_001611ce_caseD_20;
  case '!':
    token->Type = NOT_OPERATOR;
    sVar5 = (token->Value)._M_string_length;
    goto LAB_001612cd;
  case '\"':
  case '#':
  case '$':
  case '%':
  case '\'':
switchD_001611ce_caseD_22:
    token->Type = OPERAND;
    std::__cxx11::string::_M_replace_aux
              ((ulong)&token->Value,(token->Value)._M_string_length,0,'\x01');
    bVar7 = true;
    bVar3 = true;
    break;
  case '&':
    if (!bVar3) {
      token->Type = AND_OPERATOR;
      sVar5 = (token->Value)._M_string_length;
      goto LAB_001612cd;
    }
LAB_001612a6:
    this->m_current = this->m_current + -1;
    goto switchD_001611ce_caseD_20;
  case '(':
    token->Type = LEFT_PARENTHESIS;
    sVar5 = (token->Value)._M_string_length;
    goto LAB_001612cd;
  case ')':
    if (bVar3) goto LAB_001612a6;
    token->Type = RIGHT_PARENTHESIS;
    sVar5 = (token->Value)._M_string_length;
LAB_001612cd:
    bVar7 = false;
    std::__cxx11::string::_M_replace_aux((ulong)&token->Value,sVar5,0,'\x01');
    break;
  default:
    if (cVar6 != '\0') {
      if (cVar6 != '|') goto switchD_001611ce_caseD_22;
      if (bVar3) goto LAB_001612a6;
      token->Type = OR_OPERATOR;
      sVar5 = (token->Value)._M_string_length;
      goto LAB_001612cd;
    }
  }
LAB_001612d2:
  if ((cVar6 == '\0') || (!bVar7)) goto LAB_001612e1;
  goto LAB_001611a0;
switchD_001611ce_caseD_20:
  bVar7 = false;
  goto LAB_001612d2;
}

Assistant:

inline bool RuleParser::readToken(RuleToken& token)
{

    // skip any preceding whitespace
    skipSpaces();
    if (m_current == m_end) return false;

    // clear out prior token value
    token.Value.clear();

    // read chars while still in token
    char c = 1;
    bool keepReading = true;
    bool inOperandString = false;
    while (keepReading && (c != 0)) {

        // get next char
        c = getNextChar();
        switch (c) {

            // current char is '('
            case (LEFT_PARENTHESIS_CHAR):
                token.Type = RuleToken::LEFT_PARENTHESIS;
                token.Value.append(1, LEFT_PARENTHESIS_CHAR);
                keepReading = false;
                break;

            // current char is ')'
            case (RIGHT_PARENTHESIS_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::RIGHT_PARENTHESIS;
                    token.Value.append(1, RIGHT_PARENTHESIS_CHAR);
                }
                keepReading = false;
                break;

            // current char is '&'
            case (AND_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::AND_OPERATOR;
                    token.Value.append(1, AND_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '|'
            case (OR_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::OR_OPERATOR;
                    token.Value.append(1, OR_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '!'
            case (NOT_OPERATOR_CHAR):
                token.Type = RuleToken::NOT_OPERATOR;
                token.Value.append(1, NOT_OPERATOR_CHAR);
                keepReading = false;
                break;

            // current char is ' '
            case (SPACE_CHAR):
                keepReading = false;
                break;

            // current char is a true value token
            default:
                if (c != 0) {
                    token.Type = RuleToken::OPERAND;
                    token.Value.append(1, c);
                    inOperandString = true;
                    keepReading = true;
                }
        }
    }

    return true;
}